

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

string * get_date_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  tm tm;
  time_t now;
  char time [1000];
  time_point *in_stack_fffffffffffffba0;
  allocator<char> *in_stack_fffffffffffffbb0;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  time_t local_400;
  char local_3f8 [1016];
  
  std::chrono::_V2::system_clock::now();
  local_400 = std::chrono::_V2::system_clock::to_time_t(in_stack_fffffffffffffba0);
  ptVar1 = gmtime(&local_400);
  __s = *(char **)ptVar1;
  this = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&ptVar1->tm_hour;
  strftime(local_3f8,1000,"%a, %d %b %Y %H:%M:%S %Z",(tm *)&stack0xfffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,in_stack_fffffffffffffbb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbb7);
  return in_RDI;
}

Assistant:

std::string get_date() {
    char time[1000];
    time_t now = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
    struct tm tm = *gmtime(&now);
    strftime(time, sizeof time, "%a, %d %b %Y %H:%M:%S %Z", &tm);

    return std::string(time);
}